

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

void google::protobuf::internal::OnShutdownRun(_func_void_void_ptr *f,void *arg)

{
  pointer *pppVar1;
  iterator __position;
  ShutdownData *this;
  pair<void_(*)(const_void_*),_const_void_*> local_30;
  
  this = ShutdownData::get();
  absl::lts_20250127::Mutex::Lock(&this->mutex);
  __position._M_current =
       (this->functions).
       super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.first = f;
  local_30.second = arg;
  if (__position._M_current ==
      (this->functions).
      super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>
    ::_M_realloc_insert<std::pair<void(*)(void_const*),void_const*>>
              ((vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>
                *)this,__position,&local_30);
  }
  else {
    (__position._M_current)->first = f;
    (__position._M_current)->second = arg;
    pppVar1 = &(this->functions).
               super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  absl::lts_20250127::Mutex::Unlock(&this->mutex);
  return;
}

Assistant:

void OnShutdownRun(void (*f)(const void*), const void* arg) {
  auto shutdown_data = ShutdownData::get();
  absl::MutexLock lock(&shutdown_data->mutex);
  shutdown_data->functions.push_back(std::make_pair(f, arg));
}